

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

void N_VInv_Serial(N_Vector x,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = *x->content;
  lVar1 = *(long *)((long)x->content + 0x10);
  lVar2 = *(long *)((long)z->content + 0x10);
  lVar4 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *(double *)(lVar2 + lVar4 * 8) = 1.0 / *(double *)(lVar1 + lVar4 * 8);
  }
  return;
}

Assistant:

void N_VInv_Serial(N_Vector x, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *zd;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = ONE / xd[i]; }

  return;
}